

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O0

void __thiscall Atari::ST::ConcreteMachine::set_gpip_input(ConcreteMachine *this)

{
  bool bVar1;
  bool bVar2;
  pointer this_00;
  pointer this_01;
  pointer pAVar3;
  bool local_8a;
  undefined1 local_60 [48];
  undefined1 local_30 [32];
  Observer local_10;
  ConcreteMachine *this_local;
  
  local_10._vptr_Observer = (_func_int **)this;
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::operator->
            ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)
             (local_30 + 0x10));
  this_00 = std::
            unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
            ::operator->((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                          *)(local_30 + 0x10));
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)local_30);
  this_01 = std::
            unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            ::operator->((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          *)local_30);
  bVar1 = DMAController::get_interrupt_line(this_01);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)(local_60 + 0x10));
  pAVar3 = std::
           unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
           ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                         *)(local_60 + 0x10));
  bVar2 = Motorola::ACIA::ACIA::get_interrupt_line(pAVar3);
  local_8a = true;
  if (!bVar2) {
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
              ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_60);
    pAVar3 = std::
             unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                           *)local_60);
    local_8a = Motorola::ACIA::ACIA::get_interrupt_line(pAVar3);
  }
  Motorola::MFP68901::MFP68901::set_port_input
            (this_00,(~bVar1 & 1U | 6) << 5 | (~local_8a & 1U) << 4 | 0xe);
  if (!bVar2) {
    std::
    unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                   *)local_60);
  }
  std::
  unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                 *)(local_60 + 0x10));
  std::
  unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_30);
  std::
  unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                 *)(local_30 + 0x10));
  return;
}

Assistant:

void set_gpip_input() {
			/*
				Atari ST GPIP bits:

					GPIP 7: monochrome monitor detect
					GPIP 6: RS-232 ring indicator
					GPIP 5: FD/HD interrupt
					GPIP 4: keyboard/MIDI interrupt
					GPIP 3: unused
					GPIP 2: RS-232 clear to send
					GPIP 1: RS-232 carrier detect
					GPIP 0: centronics busy
			*/
			mfp_->set_port_input(
				0x80 |	// b7: Monochrome monitor detect (0 = is monochrome).
				0x40 |	// b6: RS-232 ring indicator.
				(dma_->get_interrupt_line() ? 0x00 : 0x20) |	// b5: FD/HS interrupt (0 = interrupt requested).
				((keyboard_acia_->get_interrupt_line() || midi_acia_->get_interrupt_line()) ? 0x00 : 0x10) |	// b4: Keyboard/MIDI interrupt (0 = interrupt requested).
				0x08 |	// b3: Unused
				0x04 |	// b2: RS-232 clear to send.
				0x02 |	// b1 : RS-232 carrier detect.
				0x00	// b0: Centronics busy (1 = busy).
			);
		}